

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawing.cxx
# Opt level: O0

int __thiscall ncursespp::draw::text(draw *this,string *text,rect_i r,color_index color)

{
  undefined8 uVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  color_index color_00;
  bool bVar5;
  rect_i r_00;
  uint local_4c;
  uint i;
  int local_34;
  int iStack_30;
  int res;
  point<int> lt;
  string *text_local;
  undefined1 auStack_18 [4];
  color_index color_local;
  rect_i r_local;
  
  color_00.index = r.right_bottom.x;
  local_34 = 0;
  r_00.right_bottom.y = 0;
  uVar1 = SUB128(r._0_12_,0);
  r_00.left_top.x = (int)uVar1;
  r_00.left_top.y = (int)((ulong)uVar1 >> 0x20);
  r_00.right_bottom.x = SUB124(r._0_12_,8);
  _auStack_18 = (point<int>)text;
  fill_rect((draw *)text,r_00,color_00);
  wattr_on(_stdscr,(color_00.index & 0xffU) << 8,0);
  local_4c = 0;
  while( true ) {
    iVar2 = rect<int>::width((rect<int> *)auStack_18);
    bVar5 = false;
    if ((int)local_4c < iVar2) {
      uVar3 = std::__cxx11::string::size();
      bVar5 = local_4c < uVar3;
    }
    if (!bVar5) break;
    res = (int)((ulong)text >> 0x20);
    iStack_30 = (int)text;
    iVar2 = wmove(_stdscr,res,iStack_30 + local_4c);
    uVar1 = _stdscr;
    if (iVar2 != -1) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)this);
      waddch(uVar1,(int)*pcVar4);
    }
    local_34 = local_34 + 1;
    local_4c = local_4c + 1;
  }
  wattr_off(_stdscr,(color_00.index & 0xffU) << 8,0);
  return local_34;
}

Assistant:

int draw::text(const std::string &text, rect_i r, color_index color)
{
    auto lt = r.left_top;
    int res = 0;
    fill_rect(r, color); // TODO: optimize!

    attron(COLOR_PAIR(color.index));
    for (auto i = 0u;
         static_cast<int>(i) < r.width() && i < text.size();
         ++i) {
        mvaddch(lt.y, lt.x + i, text[i]);
        res ++;
    }
    attroff(COLOR_PAIR(color.index));
    return res;
}